

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t archive_mstring_update_utf8(archive_conflict *a,archive_mstring *aes,char *utf8)

{
  wchar_t wVar1;
  size_t sVar2;
  char *tc;
  archive_string_conv *sc;
  
  if (utf8 == (char *)0x0) {
    aes->aes_set = L'\0';
  }
  else {
    (aes->aes_utf8).length = 0;
    sVar2 = strlen(utf8);
    archive_strncat(&aes->aes_utf8,utf8,sVar2);
    (aes->aes_mbs).length = 0;
    (aes->aes_wcs).length = 0;
    aes->aes_set = L'\x02';
    tc = get_current_charset(a);
    sc = get_sconv_object(a,"UTF-8",tc,L'\x06');
    if (sc == (archive_string_conv *)0x0) {
      return L'\xffffffff';
    }
    sVar2 = strlen(utf8);
    (aes->aes_mbs).length = 0;
    wVar1 = archive_strncat_l(&aes->aes_mbs,utf8,sVar2,sc);
    if (a == (archive_conflict *)0x0) {
      free_sconv_object(sc);
    }
    if (wVar1 != L'\0') {
      return L'\xffffffff';
    }
    aes->aes_set = L'\x03';
    wVar1 = archive_wstring_append_from_mbs(&aes->aes_wcs,(aes->aes_mbs).s,(aes->aes_mbs).length);
    if (wVar1 != L'\0') {
      return L'\xffffffff';
    }
    aes->aes_set = L'\a';
  }
  return L'\0';
}

Assistant:

int
archive_mstring_update_utf8(struct archive *a, struct archive_mstring *aes,
    const char *utf8)
{
	struct archive_string_conv *sc;
	int r;

	if (utf8 == NULL) {
		aes->aes_set = 0;
		return (0); /* Succeeded in clearing everything. */
	}

	/* Save the UTF8 string. */
	archive_strcpy(&(aes->aes_utf8), utf8);

	/* Empty the mbs and wcs strings. */
	archive_string_empty(&(aes->aes_mbs));
	archive_wstring_empty(&(aes->aes_wcs));

	aes->aes_set = AES_SET_UTF8;	/* Only UTF8 is set now. */

	sc = archive_string_conversion_from_charset(a, "UTF-8", 1);
	if (sc == NULL)
		return (-1);/* Couldn't allocate memory for sc. */

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* On Windows, there's no good way to convert from UTF8 -> MBS directly, so
	 * prefer to first convert to WCS as (1) it's wasteful to throw away the
	 * intermediate result, and (2) WCS will still be set even if we fail to
	 * convert to MBS (e.g. with ACP that can't represent the characters) */
	r = archive_wstring_append_from_mbs_in_codepage(&(aes->aes_wcs),
		aes->aes_utf8.s, aes->aes_utf8.length, sc);

	if (a == NULL)
		free_sconv_object(sc);
	if (r != 0)
		return (-1); /* This will guarantee we can't convert to MBS */
	aes->aes_set = AES_SET_UTF8 | AES_SET_WCS; /* Both UTF8 and WCS set. */

	/* Try converting WCS to MBS, return false on failure. */
	if (archive_string_append_from_wcs(&(aes->aes_mbs), aes->aes_wcs.s,
	    aes->aes_wcs.length))
		return (-1);
#else
	/* Try converting UTF-8 to MBS, return false on failure. */
	r = archive_strcpy_l(&(aes->aes_mbs), utf8, sc);

	if (a == NULL)
		free_sconv_object(sc);
	if (r != 0)
		return (-1);
	aes->aes_set = AES_SET_UTF8 | AES_SET_MBS; /* Both UTF8 and MBS set. */

	/* Try converting MBS to WCS, return false on failure. */
	if (archive_wstring_append_from_mbs(&(aes->aes_wcs), aes->aes_mbs.s,
	    aes->aes_mbs.length))
		return (-1);
#endif

	/* All conversions succeeded. */
	aes->aes_set = AES_SET_UTF8 | AES_SET_WCS | AES_SET_MBS;

	return (0);
}